

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

bool __thiscall
cmCTestMultiProcessHandler::AllocateResources(cmCTestMultiProcessHandler *this,int index)

{
  _Base_ptr p_Var1;
  bool bVar2;
  bool bVar3;
  mapped_type *ppcVar4;
  mapped_type *this_00;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  int index_local;
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_>_>
  *local_98;
  _Rb_tree_node_base *local_90;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>_>_>_>
  allocations;
  ResourceAllocation local_58;
  
  bVar2 = true;
  if (this->TestHandler->UseResourceSpec == true) {
    allocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &allocations._M_t._M_impl.super__Rb_tree_header._M_header;
    allocations._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    allocations._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    allocations._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    index_local = index;
    allocations._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         allocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar2 = TryAllocateResources
                      (this,index,&allocations,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError>_>_>
                        *)0x0);
    if (bVar2) {
      local_98 = std::map<$a129e267$>::operator[](&this->AllocatedResources,&index_local);
      ppcVar4 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&(this->Properties).
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,&index_local);
      std::
      vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_>_>
      ::resize(local_98,((long)((*ppcVar4)->ResourceGroups).
                               super__Vector_base<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)((*ppcVar4)->ResourceGroups).
                              super__Vector_base<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18);
      p_Var5 = allocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while ((_Rb_tree_header *)p_Var5 != &allocations._M_t._M_impl.super__Rb_tree_header) {
        p_Var1 = p_Var5[2]._M_parent;
        local_90 = p_Var5;
        for (p_Var6 = *(_Base_ptr *)(p_Var5 + 2); p_Var6 != p_Var1;
            p_Var6 = (_Base_ptr)&p_Var6[1]._M_left) {
          bVar3 = cmCTestResourceAllocator::AllocateResource
                            (&this->ResourceAllocator,(string *)(p_Var5 + 1),
                             (string *)&p_Var6->_M_left,*(uint *)&p_Var6->_M_parent);
          if (!bVar3) {
            __assert_fail("result",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                          ,0x10f,"bool cmCTestMultiProcessHandler::AllocateResources(int)");
          }
          this_00 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>
                    ::operator[]((local_98->
                                 super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + *(long *)p_Var6,
                                 (key_type *)(p_Var5 + 1));
          std::__cxx11::string::string((string *)&local_58,(string *)&p_Var6->_M_left);
          local_58.Slots = *(uint *)&p_Var6->_M_parent;
          std::
          vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>
          ::emplace_back<cmCTestMultiProcessHandler::ResourceAllocation>(this_00,&local_58);
          std::__cxx11::string::~string((string *)&local_58);
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(local_90);
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>_>_>_>
    ::~_Rb_tree(&allocations._M_t);
  }
  return bVar2;
}

Assistant:

bool cmCTestMultiProcessHandler::AllocateResources(int index)
{
  if (!this->TestHandler->UseResourceSpec) {
    return true;
  }

  std::map<std::string, std::vector<cmCTestBinPackerAllocation>> allocations;
  if (!this->TryAllocateResources(index, allocations)) {
    return false;
  }

  auto& allocatedResources = this->AllocatedResources[index];
  allocatedResources.resize(this->Properties[index]->ResourceGroups.size());
  for (auto const& it : allocations) {
    for (auto const& alloc : it.second) {
      bool result = this->ResourceAllocator.AllocateResource(
        it.first, alloc.Id, alloc.SlotsNeeded);
      (void)result;
      assert(result);
      allocatedResources[alloc.ProcessIndex][it.first].push_back(
        { alloc.Id, static_cast<unsigned int>(alloc.SlotsNeeded) });
    }
  }

  return true;
}